

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  ostream *poVar2;
  string *path;
  int iVar3;
  
  iVar3 = -1;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xd])();
      if ((this->GraphVizFile)._M_string_length != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Generate graphviz: ");
        poVar2 = std::operator<<(poVar2,(string *)&this->GraphVizFile);
        std::endl<char,std::char_traits<char>>(poVar2);
        GenerateGraphViz(this,&this->GraphVizFile);
      }
      if (this->WarnUnusedCli == true) {
        RunCheckForUnusedVariables(this);
      }
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (!bVar1) {
        path = GetHomeOutputDirectory_abi_cxx11_(this);
        SaveCache(this,path);
        cmFileAPI::WriteReplies
                  ((this->FileAPI)._M_t.
                   super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                   super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                   super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile);
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  this->SaveCache(this->GetHomeOutputDirectory());

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI->WriteReplies();
#endif

  return 0;
}